

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtilizationWidget.cpp
# Opt level: O1

void __thiscall UtilizationWidget::drawGraph(UtilizationWidget *this)

{
  vector<Point<float>,_std::allocator<Point<float>_>_> *points_00;
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  vector<Point<float>,_std::allocator<Point<float>_>_> *pvVar4;
  float *pfVar5;
  long lVar6;
  PointF scale;
  bool bVar7;
  int iVar8;
  QColor *pQVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  undefined4 extraout_XMM0_Db;
  QPen pen;
  anon_class_4_1_24fd66d6 xPos;
  QColor color;
  anon_class_4_1_60e07675 yPos;
  vector<Point<float>,_std::allocator<Point<float>_>_> points;
  anon_class_32_4_58ce38c5 drawGraph;
  undefined1 local_b0 [12];
  anon_class_4_1_24fd66d6 local_a4;
  QColor local_a0;
  UtilizationWidget *local_90;
  anon_class_4_1_60e07675 local_84;
  vector<Point<float>,_std::allocator<Point<float>_>_> local_80;
  float local_68;
  float fStack_64;
  undefined4 uStack_5c;
  anon_class_32_4_58ce38c5 local_50;
  
  lVar12 = *(long *)&this->field_0x20;
  iVar8 = *(int *)(lVar12 + 0x1c);
  iVar11 = *(int *)(lVar12 + 0x14);
  iVar1 = *(int *)(lVar12 + 0x18);
  iVar2 = *(int *)(lVar12 + 0x20);
  local_a0.cspec = Invalid;
  local_a0.ct.argb.alpha = 0xffff;
  local_a0.ct.argb.red = 0;
  local_a0.ct._4_6_ = 0;
  QPen::QPen((QPen *)local_b0);
  QPen::setWidth((int)(QPen *)local_b0);
  local_84.graphHeight = (float)((iVar2 - iVar1) + 1);
  local_a4.graphWidth = (float)((iVar8 - iVar11) + 1);
  local_50.xPos = &local_a4;
  local_50.yPos = &local_84;
  local_50.color = &local_a0;
  lVar13 = 0;
  lVar12 = 0;
  local_90 = this;
  local_68 = local_a4.graphWidth;
  fStack_64 = local_84.graphHeight;
  uStack_5c = extraout_XMM0_Db;
  local_50.this = this;
  while( true ) {
    iVar8 = InfoProvider::getGPUCount();
    if (iVar8 <= lVar12) break;
    pQVar9 = SettingsManager::getGPUColor((int)lVar12);
    uVar3 = *(undefined8 *)pQVar9;
    local_a0.ct._4_6_ = (undefined6)((ulong)*(undefined8 *)((long)&pQVar9->ct + 2) >> 0x10);
    local_a0.cspec = (Spec)uVar3;
    local_a0.ct.argb.alpha = (ushort)((ulong)uVar3 >> 0x20);
    local_a0.ct.argb.red = (ushort)((ulong)uVar3 >> 0x30);
    QPen::setColor((QColor *)local_b0);
    QPainter::setPen((QPen *)&this->painter);
    pvVar4 = (local_90->graphPoints).ptr;
    bVar7 = SettingsManager::isSmoothGraph();
    points_00 = (vector<Point<float>,_std::allocator<Point<float>_>_> *)
                ((long)&(pvVar4->super__Vector_base<Point<float>,_std::allocator<Point<float>_>_>).
                        _M_impl.super__Vector_impl_data._M_start + lVar13);
    if (bVar7) {
      pfVar5 = *(float **)
                ((long)&(pvVar4->super__Vector_base<Point<float>,_std::allocator<Point<float>_>_>).
                        _M_impl.super__Vector_impl_data._M_start + lVar13);
      lVar6 = *(long *)((long)&(pvVar4->
                               super__Vector_base<Point<float>,_std::allocator<Point<float>_>_>).
                               _M_impl.super__Vector_impl_data._M_finish + lVar13);
      uVar10 = lVar6 - (long)pfVar5 >> 3;
      iVar11 = (int)(((*(float *)(lVar6 + -8) - *pfVar5) * local_a4.graphWidth) / 3.0);
      iVar8 = (int)uVar10;
      if (iVar8 <= iVar11) {
        iVar8 = iVar11;
      }
      if (uVar10 < (ulong)(long)iVar8) {
        scale.y = fStack_64;
        scale.x = local_68;
        PCHIPInterpolator::getInterpolatedPoints(&local_80,points_00,scale,iVar8);
        UtilizationWidget::drawGraph::anon_class_32_4_58ce38c5::operator()(&local_50,&local_80);
        if (local_80.super__Vector_base<Point<float>,_std::allocator<Point<float>_>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_80.super__Vector_base<Point<float>,_std::allocator<Point<float>_>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_80.
                                super__Vector_base<Point<float>,_std::allocator<Point<float>_>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_80.
                                super__Vector_base<Point<float>,_std::allocator<Point<float>_>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        UtilizationWidget::drawGraph::anon_class_32_4_58ce38c5::operator()(&local_50,points_00);
      }
    }
    else {
      UtilizationWidget::drawGraph::anon_class_32_4_58ce38c5::operator()(&local_50,points_00);
    }
    lVar12 = lVar12 + 1;
    lVar13 = lVar13 + 0x18;
  }
  QPen::~QPen((QPen *)local_b0);
  return;
}

Assistant:

void UtilizationWidget::drawGraph() {
    auto graphWidth = static_cast<float>(size().width());
    auto graphHeight = static_cast<float>(size().height());

    QColor color;
    QPen pen;
    pen.setWidth(2);

    auto xPos = [graphWidth](float x) { return x * graphWidth; };
    auto yPos = [graphHeight](float y) { return graphHeight - graphHeight * y; };

    auto drawGraph = [&](const std::vector<PointF> &points) {
        QPainterPath filling;

        auto pointPos = [&](PointF point) -> QPointF {
            return {xPos(point.x), yPos(point.y)};
        };

        filling.moveTo(pointPos(points[0]));

        for (size_t i = 1; i < points.size(); i++)
            filling.lineTo(pointPos(points[i]));

        painter.drawPath(filling);

        filling.lineTo(pointPos({1.0f, 0.0f}));
        filling.lineTo(pointPos({points[0].x, 0.0f}));
        filling.lineTo(pointPos({points[0].x, points[0].y}));

        color.setAlpha(64);
        painter.fillPath(filling, QBrush(color));
    };

    for (int g = 0; g < InfoProvider::getGPUCount(); g++) {
        color = SettingsManager::getGPUColor(g);
        pen.setColor(color);
        painter.setPen(pen);

        auto &gPoints = graphPoints[g];

        if (SettingsManager::isSmoothGraph()) {
            int count = std::max(
                static_cast<int>(gPoints.size()),
                static_cast<int>(xPos(gPoints.back().x - gPoints.front().x) / 3)
            );

            if (count > gPoints.size()) {
                auto points = PCHIPInterpolator::getInterpolatedPoints(gPoints, {graphWidth, graphHeight}, count);
                drawGraph(points);
            } else {
                drawGraph(gPoints);
            }
        } else {
            drawGraph(gPoints);
        }
    }
}